

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closureHoisting.h
# Opt level: O0

void __thiscall
SQCompilation::ClosureHoistingOpt::VarScope::VarScope
          (VarScope *this,Arena *arena,VarScope *p,ScopeKind k)

{
  _Rb_tree_color in_ECX;
  undefined8 in_RDX;
  Arena *in_RSI;
  ArenaMap<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>_> *in_RDI;
  Allocator *in_stack_ffffffffffffffa8;
  Allocator *allocator;
  StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_> local_40 [3];
  StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_> local_28;
  _Rb_tree_color local_1c;
  undefined8 local_18;
  Arena *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ArenaObj::ArenaObj((ArenaObj *)in_RDI);
  (((map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
     *)&in_RDI->
        super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
   )->_M_t)._M_impl.super__Node_allocator._arena = (Arena *)&PTR__VarScope_0021ca78;
  StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>::StdArenaAllocator
            (&local_28,local_10);
  ArenaMap<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str>::ArenaMap
            ((ArenaMap<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str> *)in_RDI,
             in_stack_ffffffffffffffa8);
  StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>::~StdArenaAllocator
            (&local_28);
  allocator = (Allocator *)
              &(((map<const_char_*,_SQCompilation::Decl_*,_SQCompilation::cmp_str,_StdArenaAllocator<std::pair<const_char_*const,_SQCompilation::Decl_*>_>_>
                  *)&in_RDI[1].
                     super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
                )->_M_t)._M_impl.field_0x8;
  StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>::StdArenaAllocator
            (local_40,local_10);
  ArenaMap<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>_>::ArenaMap
            (in_RDI,allocator);
  StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>::~StdArenaAllocator
            (local_40);
  *(undefined8 *)
   &in_RDI[2].
    super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
    ._M_t._M_impl.field_0x8 = local_18;
  in_RDI[2].
  super_map<SQCompilation::FunctionDecl_*,_int,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_1c;
  return;
}

Assistant:

VarScope(Arena *arena, VarScope *p, enum ScopeKind k) : symbols(SymbolsMap::Allocator(arena)), parent(p), candidates(CandidateMap::Allocator(arena)), kind(k) {}